

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_DigestInit(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism)

{
  byte bVar1;
  int iVar2;
  Session *this_00;
  CryptoFactory *pCVar3;
  long *plVar4;
  long *in_RDX;
  Session *in_RDI;
  CK_SESSION_HANDLE unaff_retaddr;
  HandleManager *in_stack_00000008;
  HashAlgorithm *hash;
  Type algo;
  Session *session;
  HashAlgorithm *inDigestOp;
  Type local_2c;
  CK_RV local_8;
  undefined4 extraout_var;
  
  if (((ulong)in_RDI->slot & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == (long *)0x0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)HandleManager::getSession(in_stack_00000008,unaff_retaddr);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar2 = Session::getOpType(this_00);
      if (iVar2 == 0) {
        inDigestOp = (HashAlgorithm *)*in_RDX;
        if (inDigestOp == (HashAlgorithm *)0x210) {
          local_2c = MD5;
        }
        else if (inDigestOp == (HashAlgorithm *)0x220) {
          local_2c = SHA1;
        }
        else if (inDigestOp == (HashAlgorithm *)0x250) {
          local_2c = SHA256;
        }
        else if (inDigestOp == (HashAlgorithm *)0x255) {
          local_2c = SHA224;
        }
        else if (inDigestOp == (HashAlgorithm *)0x260) {
          local_2c = SHA384;
        }
        else {
          if (inDigestOp != (HashAlgorithm *)0x270) {
            return 0x70;
          }
          local_2c = SHA512;
        }
        pCVar3 = CryptoFactory::i();
        iVar2 = (*pCVar3->_vptr_CryptoFactory[4])(pCVar3,(ulong)local_2c);
        plVar4 = (long *)CONCAT44(extraout_var,iVar2);
        if (plVar4 == (long *)0x0) {
          local_8 = 0x70;
        }
        else {
          bVar1 = (**(code **)(*plVar4 + 0x10))();
          if ((bVar1 & 1) == 0) {
            pCVar3 = CryptoFactory::i();
            (*pCVar3->_vptr_CryptoFactory[5])(pCVar3,plVar4);
            local_8 = 5;
          }
          else {
            Session::setOpType(this_00,4);
            Session::setDigestOp(in_RDI,inDigestOp);
            Session::setHashAlgo(this_00,local_2c);
            local_8 = 0;
          }
        }
      }
      else {
        local_8 = 0x90;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_DigestInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the mechanism
	HashAlgo::Type algo = HashAlgo::Unknown;
	switch(pMechanism->mechanism) {
#ifndef WITH_FIPS
		case CKM_MD5:
			algo = HashAlgo::MD5;
			break;
#endif
		case CKM_SHA_1:
			algo = HashAlgo::SHA1;
			break;
		case CKM_SHA224:
			algo = HashAlgo::SHA224;
			break;
		case CKM_SHA256:
			algo = HashAlgo::SHA256;
			break;
		case CKM_SHA384:
			algo = HashAlgo::SHA384;
			break;
		case CKM_SHA512:
			algo = HashAlgo::SHA512;
			break;
#ifdef WITH_GOST
		case CKM_GOSTR3411:
			algo = HashAlgo::GOST;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}
	HashAlgorithm* hash = CryptoFactory::i()->getHashAlgorithm(algo);
	if (hash == NULL) return CKR_MECHANISM_INVALID;

	// Initialize hashing
	if (hash->hashInit() == false)
	{
		CryptoFactory::i()->recycleHashAlgorithm(hash);
		return CKR_GENERAL_ERROR;
	}

	session->setOpType(SESSION_OP_DIGEST);
	session->setDigestOp(hash);
	session->setHashAlgo(algo);

	return CKR_OK;
}